

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Tile * createTile(Image *image,int x,int y,int w,int h,
                 vector<Tile_*,_std::allocator<Tile_*>_> *tiles,bool mirrored)

{
  uint uVar1;
  Tile *this;
  Tile *pTVar2;
  Tile *pTVar3;
  uchar *__dest;
  pointer __src;
  int iVar4;
  bool bVar5;
  
  this = (Tile *)operator_new(0x50);
  Tile::Tile(this,0,false,false,false,(Tile *)0x0);
  uVar1 = image->width;
  __src = (image->pixels).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start + (long)x + (ulong)(y * uVar1);
  __dest = this->data;
  iVar4 = 0;
  if (0 < h) {
    iVar4 = h;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    memcpy(__dest,__src,(long)w);
    __dest = __dest + w;
    __src = __src + uVar1;
  }
  pTVar2 = find_duplicate(this,tiles);
  this->original_tile = pTVar2;
  if (pTVar2 != (Tile *)0x0) {
    this->is_duplicate = true;
  }
  if ((mirrored) && (this->is_duplicate == false)) {
    pTVar2 = Tile::flipX(this);
    pTVar3 = find_duplicate(pTVar2,tiles);
    this->original_tile = pTVar3;
    operator_delete(pTVar2);
    if (this->original_tile == (Tile *)0x0) {
      pTVar2 = Tile::flipY(this);
      pTVar3 = find_duplicate(pTVar2,tiles);
      this->original_tile = pTVar3;
      operator_delete(pTVar2);
      if (this->original_tile == (Tile *)0x0) {
        pTVar2 = Tile::flipXY(this);
        pTVar3 = find_duplicate(pTVar2,tiles);
        this->original_tile = pTVar3;
        operator_delete(pTVar2);
        if (this->original_tile == (Tile *)0x0) {
          return this;
        }
        this->flipped_x = true;
        this->flipped_y = true;
      }
      else {
        this->flipped_y = true;
      }
    }
    else {
      this->flipped_x = true;
    }
    this->is_duplicate = true;
  }
  return this;
}

Assistant:

Tile *createTile(Image *image, int x, int y, int w, int h, std::vector<Tile *> *tiles, bool mirrored) {
    Tile *tile = new Tile(0, false, false, false, nullptr);

    unsigned char *ptr = &image->pixels[0] + y * image->width + x;
    unsigned char *tile_ptr = tile->data;
    for (int i = 0; i < h; i++) {
        memcpy(tile_ptr, ptr, w);
        tile_ptr += w;
        ptr += image->width;
    }

    tile->original_tile = find_duplicate(tile, tiles);
    if (tile->original_tile) {
        tile->is_duplicate = true;
    }

    if (mirrored && !tile->is_duplicate) {
        Tile *flipped = tile->flipX();
        tile->original_tile = find_duplicate(flipped, tiles);
        delete flipped;
        if (tile->original_tile) {
            tile->flipped_x = true;
            tile->is_duplicate = true;
        } else {
            flipped = tile->flipY();
            tile->original_tile = find_duplicate(flipped, tiles);
            delete flipped;
            if (tile->original_tile) {
                tile->flipped_y = true;
                tile->is_duplicate = true;
            } else {
                flipped = tile->flipXY();
                tile->original_tile = find_duplicate(flipped, tiles);
                delete flipped;
                if (tile->original_tile) {
                    tile->flipped_x = true;
                    tile->flipped_y = true;
                    tile->is_duplicate = true;
                }
            }
        }
    }

    return tile;
}